

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  unsigned_long_long uVar2;
  char *pcVar3;
  char *__src;
  unsigned_long_long value;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar4;
  scoped_padder p;
  format_int local_70;
  scoped_padder local_50;
  
  scoped_padder::scoped_padder(&local_50,10,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 / 1000000000;
  value = -uVar2;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  pcVar3 = fmt::v6::format_int::format_decimal(&local_70,value);
  __src = pcVar3;
  if (lVar1 < -999999999) {
    __src = pcVar3 + -1;
    pcVar3[-1] = '-';
  }
  __n = (long)(local_70.buffer_ + 0x15) - (long)__src;
  uVar4 = (dest->super_buffer<char>).size_ + __n;
  local_70.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
  }
  if (local_70.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar4;
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }